

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

bool FastPForLib::Simple16<false>::trymefull<14u,2u>(uint32_t *n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0xe) break;
    uVar1 = uVar2 + 1;
  } while (n[uVar2] < 4);
  return 0xd < uVar2;
}

Assistant:

static bool trymefull(const uint32_t *n) {
    const uint32_t min = num1;
    for (uint32_t i = 0; i < min; i++) {
      if (n[i] >= (1U << log1))
        return false;
    }
    return true;
  }